

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Formula.cpp
# Opt level: O2

Formula * Kernel::Formula::createLet(uint functor,VList *variables,TermList body,Formula *contents)

{
  TermList TVar1;
  TermList bodySort;
  BoolTermFormula *this;
  
  TVar1._content = (uint64_t)Term::createFormula(contents);
  bodySort = AtomicSort::boolSort();
  TVar1._content = (uint64_t)Term::createLet(functor,variables,body,TVar1,bodySort);
  this = (BoolTermFormula *)BoolTermFormula::operator_new(0x30);
  BoolTermFormula::BoolTermFormula(this,TVar1);
  return &this->super_Formula;
}

Assistant:

Formula* Formula::createLet(unsigned functor, VList* variables, TermList body, Formula* contents)
{
  TermList contentsTerm(Term::createFormula(contents));
  TermList letTerm(Term::createLet(functor, variables, body, contentsTerm, AtomicSort::boolSort()));
  return new BoolTermFormula(letTerm);
}